

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O0

char * __thiscall cppcms::impl::string_map::get(string_map *this,char *ckey)

{
  bool bVar1;
  entry *this_00;
  size_type sVar2;
  reference pvVar3;
  entry *in_RDI;
  int pos;
  entry e;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar4;
  entry *in_stack_ffffffffffffffc0;
  int local_34;
  uint local_20;
  char *local_8;
  
  entry::entry(in_stack_ffffffffffffffc0,(char *)in_RDI,
               (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  this_00 = (entry *)(ulong)local_20;
  sVar2 = std::
          vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
          ::size((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                  *)&in_RDI->hash);
  local_34 = (int)((ulong)this_00 % sVar2);
  while( true ) {
    pvVar3 = std::
             vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
             ::operator[]((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                           *)&in_RDI->hash,(long)local_34);
    bVar4 = 0;
    if (pvVar3->key != (char *)0x0) {
      std::vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
      ::operator[]((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                    *)&in_RDI->hash,(long)local_34);
      bVar1 = entry::operator==(this_00,in_RDI);
      bVar4 = bVar1 ^ 0xff;
    }
    if ((bVar4 & 1) == 0) break;
    sVar2 = std::
            vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
            ::size((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                    *)&in_RDI->hash);
    local_34 = (int)((ulong)(long)(local_34 + 1) % sVar2);
  }
  pvVar3 = std::
           vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
           ::operator[]((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                         *)&in_RDI->hash,(long)local_34);
  if (pvVar3->key == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    pvVar3 = std::
             vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
             ::operator[]((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                           *)&in_RDI->hash,(long)local_34);
    local_8 = pvVar3->value;
  }
  return local_8;
}

Assistant:

char const *get(char const *ckey)
			{
				entry e(ckey);
				int pos = e.hash % data_.size();
				while(data_[pos].key && !(data_[pos] == e)) 
					pos = (pos + 1) % data_.size();
				if(data_[pos].key == 0)
					return 0;
				return data_[pos].value;
			}